

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReduceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  LogMessage *other;
  LayerUnion LVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  Result r;
  string err;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8 [2];
  long local_d8 [2];
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  string local_50;
  
  Result::Result((Result *)local_130);
  validateInputCount((Result *)local_88,layer,1,1);
  local_130 = local_88;
  std::__cxx11::string::operator=((string *)&local_128,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != local_70) {
    operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
  }
  bVar5 = Result::good((Result *)local_130);
  if (bVar5) {
    validateOutputCount((Result *)local_88,layer,1,1);
    local_130 = local_88;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != local_70) {
      operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
    }
  }
  if ((this->ndArrayInterpretation == true) &&
     (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_)) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Reduce","");
    validateInputOutputRankEquality((Result *)local_88,layer,&local_50,&this->blobNameToRank);
    local_130 = local_88;
    std::__cxx11::string::operator=((string *)&local_128,(string *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != local_70) {
      operator_delete(local_80._M_p,local_70[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar5 = Result::good((Result *)local_130);
    if (!bVar5) goto LAB_002cea77;
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      other = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_88,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,other);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_88);
    }
    iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24);
    paVar1 = &local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    if (layer->_oneof_case_[0] == 0x118) {
      LVar7 = layer->layer_;
    }
    else {
      LVar7.reduce_ = Specification::ReduceLayerParams::default_instance();
    }
    iVar6 = *(int *)&((LVar7.convolution_)->kernelsize_).rep_;
    switch(iVar6) {
    case 0:
      iVar6 = 2;
      break;
    case 1:
      iVar6 = 1;
      break;
    case 2:
    case 3:
    case 4:
      iVar6 = 0;
      break;
    default:
      if (iVar6 == 0x7fffffff) {
        psVar3 = (layer->name_).ptr_;
        local_e8[0] = local_d8;
        pcVar4 = (psVar3->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e8,pcVar4,pcVar4 + psVar3->_M_string_length,-iVar6);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x329412);
        local_108 = &local_f8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_f8 = *plVar10;
          lStack_f0 = plVar8[3];
        }
        else {
          local_f8 = *plVar10;
          local_108 = (long *)*plVar8;
        }
        local_100 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
        goto LAB_002cebbb;
      }
      goto LAB_002cea5d;
    }
    if (iVar2 <= iVar6) {
      psVar3 = (layer->name_).ptr_;
      local_e8[0] = local_d8;
      pcVar4 = (psVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar4,pcVar4 + psVar3->_M_string_length);
      puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)local_e8,0,(char *)0x0,0x329449);
      local_108 = &local_f8;
      plVar8 = puVar9 + 2;
      if ((long *)*puVar9 == plVar8) {
        local_f8 = *plVar8;
        lStack_f0 = puVar9[3];
      }
      else {
        local_f8 = *plVar8;
        local_108 = (long *)*puVar9;
      }
      local_100 = puVar9[1];
      *puVar9 = plVar8;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
LAB_002cebbb:
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_98 = *plVar10;
        lStack_90 = plVar8[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar10;
        local_a8 = (long *)*plVar8;
      }
      local_a0 = plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0],local_d8[0] + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_002ceac5;
    }
LAB_002cea5d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_002cea77:
  __return_storage_ptr__->m_type = local_130._0_4_;
  __return_storage_ptr__->m_reason = local_130._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p == &local_118) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_118._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_128._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_120;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_128._M_p = (pointer)&local_118;
LAB_002ceac5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p != &local_118) {
    operator_delete(local_128._M_p,
                    CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReduceLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        r = validateInputOutputRankEquality(layer, "Reduce", blobNameToRank);
        if (!r.good()) {return r;}
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.reduce().axis()) {
            case Specification::ReduceLayerParams::CHW:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::HW:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::H:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::W:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case Specification::ReduceLayerParams::C:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MIN_SENTINEL_DO_NOT_USE_:
            case CoreML::Specification::ReduceLayerParams_ReduceAxis_ReduceLayerParams_ReduceAxis_INT_MAX_SENTINEL_DO_NOT_USE_:
                err = "Reduce layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Reduce layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimensions provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}